

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

parser_error parse_buy_flag(parser *p)

{
  int iVar1;
  wchar_t wVar2;
  parser_error pVar3;
  void *pvVar4;
  char *pcVar5;
  undefined8 *puVar6;
  
  pvVar4 = parser_priv(p);
  if (pvVar4 == (void *)0x0) {
    pVar3 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar5 = parser_getsym(p,"flag");
    iVar1 = lookup_flag(obj_flags,pcVar5);
    if (iVar1 == 0) {
      pVar3 = PARSE_ERROR_INVALID_FLAG;
    }
    else {
      puVar6 = (undefined8 *)mem_zalloc(0x18);
      puVar6[2] = (long)iVar1;
      pcVar5 = parser_getstr(p,"base");
      wVar2 = tval_find_idx(pcVar5);
      puVar6[1] = (long)wVar2;
      *puVar6 = *(undefined8 *)((long)pvVar4 + 0x78);
      *(undefined8 **)((long)pvVar4 + 0x78) = puVar6;
      pVar3 = PARSE_ERROR_NONE;
    }
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_buy_flag(struct parser *p) {
	struct store *s = parser_priv(p);
	int flag;

	if (!s)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	flag = lookup_flag(obj_flags, parser_getsym(p, "flag"));

	if (flag == FLAG_END) {
		return PARSE_ERROR_INVALID_FLAG;
	} else {
		struct object_buy *buy = mem_zalloc(sizeof(*buy));

		buy->flag = flag;
		buy->tval = tval_find_idx(parser_getstr(p, "base"));
		buy->next = s->buy;
		s->buy = buy;

		return PARSE_ERROR_NONE;
	}
}